

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O2

void PIT_CeilingRaise(AActor *thing,FChangePosition *cpos)

{
  double oldz;
  double dVar1;
  player_t *ppVar2;
  bool bVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  AActor *onmobj;
  
  bVar3 = P_AdjustFloorCeil(thing,cpos);
  if (((thing->flags4).Value & 0x80) != 0) {
    return;
  }
  oldz = (thing->__Pos).Z;
  dVar5 = thing->floorz;
  if (dVar5 <= oldz) {
LAB_0041cd0e:
    if ((bVar3 || ((thing->flags2).Value & 0x1000) == 0) ||
       (((thing->ceilingz <= thing->Height + oldz ||
         (bVar3 = P_TestMobjZ(thing,true,&onmobj), bVar3)) ||
        (dVar5 = (onmobj->__Pos).Z, (thing->__Pos).Z < dVar5)))) goto LAB_0041cd94;
    dVar6 = thing->ceilingz - thing->Height;
    dVar5 = dVar5 + onmobj->Height;
    if (dVar5 <= dVar6) {
      dVar6 = dVar5;
    }
    (thing->__Pos).Z = dVar6;
  }
  else {
    dVar6 = thing->ceilingz;
    dVar1 = thing->Height;
    if ((oldz + dVar1 < dVar6 - cpos->moveamt) || (((thing->flags).Value & 0x20000000) != 0))
    goto LAB_0041cd0e;
    uVar4 = -(ulong)(dVar6 < dVar5 + dVar1);
    (thing->__Pos).Z = (double)(~uVar4 & (ulong)dVar5 | (ulong)(dVar6 - dVar1) & uVar4);
    P_CheckFakeFloorTriggers(thing,oldz,false);
  }
  AActor::UpdateRenderSectorList(thing);
LAB_0041cd94:
  ppVar2 = thing->player;
  if ((ppVar2 != (player_t *)0x0) && (ppVar2->mo == (APlayerPawn *)thing)) {
    ppVar2->viewz = ((thing->__Pos).Z - oldz) + ppVar2->viewz;
  }
  return;
}

Assistant:

void PIT_CeilingRaise(AActor *thing, FChangePosition *cpos)
{
	bool isgood = P_AdjustFloorCeil(thing, cpos);
	double oldz = thing->Z();

	if (thing->flags4 & MF4_ACTLIKEBRIDGE) return; // do not move bridge things

	// For DOOM compatibility, only move things that are inside the floor.
	// (or something else?) Things marked as hanging from the ceiling will
	// stay where they are.
	if (thing->Z() < thing->floorz &&
		thing->Top() >= thing->ceilingz - cpos->moveamt &&
		!(thing->flags & MF_NOLIFTDROP))
	{
		thing->SetZ(thing->floorz);
		if (thing->Top() > thing->ceilingz)
		{
			thing->SetZ(thing->ceilingz - thing->Height);
		}
		P_CheckFakeFloorTriggers(thing, oldz);
		thing->UpdateRenderSectorList();
	}
	else if ((thing->flags2 & MF2_PASSMOBJ) && !isgood && thing->Top() < thing->ceilingz)
	{
		AActor *onmobj;
		if (!P_TestMobjZ(thing, true, &onmobj) && onmobj->Z() <= thing->Z())
		{
			thing->SetZ(MIN(thing->ceilingz - thing->Height, onmobj->Top()));
			thing->UpdateRenderSectorList();
		}
	}
	if (thing->player && thing->player->mo == thing)
	{
		thing->player->viewz += thing->Z() - oldz;
	}
}